

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O1

void __thiscall
burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
subsequence_iterator
          (subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
           *this,int *first,int *last)

{
  pointer ppiVar1;
  __normal_iterator<const_int_**,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> _Var2;
  allocator_type local_19;
  
  this->m_begin = first;
  this->m_end = last;
  std::vector<const_int_*,_std::allocator<const_int_*>_>::vector
            (&this->m_subsequence,(long)last - (long)first >> 2,&local_19);
  this->m_subsequence_size = 0;
  ppiVar1 = (this->m_subsequence).super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  _Var2 = next_chain<__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,int_const*,burst::next_subsequence<__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,int_const*>(__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,int_const*,int_const*)::_lambda(auto:1,(auto:2&&)___)_1_>
                    (ppiVar1,ppiVar1,this->m_begin,this->m_end);
  this->m_subsequence_size =
       (long)_Var2._M_current -
       (long)(this->m_subsequence).super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

subsequence_iterator (ForwardIterator first, ForwardIterator last):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subsequence(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subsequence_size(0)
        {
            increment();
        }